

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void mtranspose(double *sig,int rows,int cols,double *col)

{
  if (0x3ff < cols && 0x3ff < rows) {
    ctranspose(sig,rows,cols,col);
    return;
  }
  stranspose(sig,rows,cols,col);
  return;
}

Assistant:

void mtranspose(double *sig, int rows, int cols,double *col) {
	int block;
	
	block = (int) BLOCKSIZE * 16;

	if (rows >= block && cols >= block)  {
		ctranspose(sig,rows,cols,col);
	} else {
		stranspose(sig,rows,cols,col);
	}
}